

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3_collation_needed16
              (sqlite3 *db,void *pCollNeededArg,
              _func_void_void_ptr_sqlite3_ptr_int_void_ptr *xCollNeeded16)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  
  sqlite3_mutex_enter((sqlite3_mutex *)0x14dd64);
  *(undefined8 *)(in_RDI + 0x170) = 0;
  *(undefined8 *)(in_RDI + 0x178) = in_RDX;
  *(undefined8 *)(in_RDI + 0x180) = in_RSI;
  sqlite3_mutex_leave((sqlite3_mutex *)0x14dda3);
  return 0;
}

Assistant:

SQLITE_API int sqlite3_collation_needed16(
  sqlite3 *db,
  void *pCollNeededArg,
  void(*xCollNeeded16)(void*,sqlite3*,int eTextRep,const void*)
){
#ifdef SQLITE_ENABLE_API_ARMOR
  if( !sqlite3SafetyCheckOk(db) ) return SQLITE_MISUSE_BKPT;
#endif
  sqlite3_mutex_enter(db->mutex);
  db->xCollNeeded = 0;
  db->xCollNeeded16 = xCollNeeded16;
  db->pCollNeededArg = pCollNeededArg;
  sqlite3_mutex_leave(db->mutex);
  return SQLITE_OK;
}